

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::InplaceVectorDeathTest_BoundsChecks_Test::
~InplaceVectorDeathTest_BoundsChecks_Test(InplaceVectorDeathTest_BoundsChecks_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(InplaceVectorDeathTest, BoundsChecks) {
  InplaceVector<int, 4> vec;
  // The vector is currently empty.
  EXPECT_DEATH_IF_SUPPORTED(vec[0], "");
  EXPECT_DEATH_IF_SUPPORTED(vec.front(), "");
  EXPECT_DEATH_IF_SUPPORTED(vec.back(), "");
  EXPECT_DEATH_IF_SUPPORTED(vec.pop_back(), "");
  int data[] = {1, 2, 3};
  vec.CopyFrom(data);
  // Some more out-of-bounds elements.
  EXPECT_DEATH_IF_SUPPORTED(vec[3], "");
  EXPECT_DEATH_IF_SUPPORTED(vec[4], "");
  EXPECT_DEATH_IF_SUPPORTED(vec[1000], "");
  // The vector cannot be resized past the capacity.
  EXPECT_DEATH_IF_SUPPORTED(vec.Resize(5), "");
  EXPECT_DEATH_IF_SUPPORTED(vec.ResizeForOverwrite(5), "");
  int too_much_data[] = {1, 2, 3, 4, 5};
  EXPECT_DEATH_IF_SUPPORTED(vec.CopyFrom(too_much_data), "");
  vec.Resize(4);
  EXPECT_DEATH_IF_SUPPORTED(vec.PushBack(42), "");
}